

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::IndirectComputeDispatchTests::init
          (IndirectComputeDispatchTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  pointer pcVar2;
  deIntptr dVar3;
  TestNode *pTVar4;
  long lVar5;
  vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
  *pvVar6;
  value_type local_68;
  GenBuffer local_4c;
  TestNode *local_48;
  long local_40;
  TestNode *local_38;
  
  if (init()::s_singleDispatchCases == '\0') {
    init((EVP_PKEY_CTX *)this);
  }
  lVar5 = 0;
  local_38 = (TestNode *)this;
  do {
    local_4c = init::s_genBuffer[lVar5].gen;
    local_40 = lVar5;
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,init::s_genBuffer[lVar5].name,
               SSBOArrayLengthTests::init::arraysSized + 1);
    local_48 = pTVar4;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    lVar5 = 0;
    do {
      pTVar4 = (TestNode *)operator_new(0xb0);
      pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pcVar2 = *(pointer *)
                ((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar5 + -0x10);
      dVar3 = *(deIntptr *)((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar5 + -8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar4,pCVar1->m_testCtx,
                 *(char **)((long)init::s_singleDispatchCases[0].workGroupSize.m_data +
                           lVar5 + -0x20),
                 *(char **)((long)(&init::s_singleDispatchCases[0].workGroupSize + -2) + lVar5));
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
      *(GenBuffer *)&pTVar4[1].m_testCtx = local_4c;
      *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
      pTVar4[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar4[1].m_description._M_string_length = 0;
      pTVar4[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar4[1].m_name._M_string_length = 0;
      *(undefined4 *)&pTVar4[1].m_name.field_2 = 0;
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__IndirectDispatchCase_00b51768;
      pTVar4[1].m_name._M_dataplus._M_p = pcVar2;
      *(undefined4 *)&pTVar4[1].m_name.field_2 =
           *(undefined4 *)((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar5 + 8);
      pTVar4[1].m_name._M_string_length =
           *(size_type *)((long)init::s_singleDispatchCases[0].workGroupSize.m_data + lVar5);
      local_68.numWorkGroups.m_data[2] =
           *(uint *)((long)init::s_singleDispatchCases[0].numWorkGroups.m_data + lVar5 + 8);
      local_68.numWorkGroups.m_data._0_8_ =
           *(undefined8 *)((long)init::s_singleDispatchCases[0].numWorkGroups.m_data + lVar5);
      local_68.offset = dVar3;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                   *)((long)&pTVar4[1].m_name.field_2 + 8),&local_68);
      tcu::TestNode::addChild(local_48,pTVar4);
      this = (IndirectComputeDispatchTests *)local_38;
      lVar5 = lVar5 + 0x38;
    } while (lVar5 != 0x188);
    pTVar4 = (TestNode *)operator_new(0xb0);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar1->m_testCtx,"multi_dispatch",
               "Dispatch multiple compute commands from single buffer");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
    *(GenBuffer *)&pTVar4[1].m_testCtx = local_4c;
    pvVar6 = (vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
              *)(&pTVar4[1].m_name.field_2._M_allocated_capacity + 1);
    *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
    pTVar4[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar4[1].m_description._M_string_length = 0;
    pTVar4[1].m_name._M_dataplus._M_p = (pointer)0x0;
    pTVar4[1].m_name._M_string_length = 0;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__IndirectDispatchCase_00b51808;
    pTVar4[1].m_name._M_dataplus._M_p = (pointer)0x400;
    pTVar4[1].m_name._M_string_length = 0x100000003;
    *(undefined4 *)&pTVar4[1].m_name.field_2 = 2;
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0xc;
    local_68.numWorkGroups.m_data[0] = 2;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0x68;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 3;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0x28;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 7;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0x34;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 4;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    tcu::TestNode::addChild(local_48,pTVar4);
    pTVar4 = (TestNode *)operator_new(0xb0);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar1->m_testCtx,"multi_dispatch_reuse_command",
               "Dispatch multiple compute commands from single buffer");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
    *(GenBuffer *)&pTVar4[1].m_testCtx = local_4c;
    pvVar6 = (vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
              *)(&pTVar4[1].m_name.field_2._M_allocated_capacity + 1);
    *(undefined8 *)((long)&pTVar4[1].m_name.field_2 + 8) = 0;
    pTVar4[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar4[1].m_description._M_string_length = 0;
    pTVar4[1].m_name._M_dataplus._M_p = (pointer)0x0;
    pTVar4[1].m_name._M_string_length = 0;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__IndirectDispatchCase_00b51858;
    pTVar4[1].m_name._M_dataplus._M_p = (pointer)0x400;
    pTVar4[1].m_name._M_string_length = 0x100000003;
    *(undefined4 *)&pTVar4[1].m_name.field_2 = 2;
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0x68;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 3;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0x68;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 3;
    local_68.numWorkGroups.m_data[2] = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0x34;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 4;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    local_68.offset = 0x34;
    local_68.numWorkGroups.m_data[0] = 1;
    local_68.numWorkGroups.m_data[1] = 1;
    local_68.numWorkGroups.m_data[2] = 4;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
    ::push_back(pvVar6,&local_68);
    tcu::TestNode::addChild(local_48,pTVar4);
    lVar5 = local_40 + 1;
  } while (local_40 == 0);
  return (int)lVar5;
}

Assistant:

void IndirectComputeDispatchTests::init (void)
{
	static const struct
	{
		const char*		name;
		GenBuffer		gen;
	} s_genBuffer[] =
	{
		{ "upload_buffer",		GEN_BUFFER_UPLOAD	},
		{ "gen_in_compute",		GEN_BUFFER_COMPUTE	}
	};

	static const struct
	{
		const char*	name;
		const char*	description;
		deUintptr	bufferSize;
		deUintptr	offset;
		UVec3		workGroupSize;
		UVec3		numWorkGroups;
	} s_singleDispatchCases[] =
	{
	//	Name										Desc											BufferSize					Offs			WorkGroupSize	NumWorkGroups
		{ "single_invocation",						"Single invocation only from offset 0",			INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "multiple_groups",						"Multiple groups dispatched from offset 0",		INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(2,3,5) },
		{ "multiple_groups_multiple_invocations",	"Multiple groups of size 2x3x1 from offset 0",	INDIRECT_COMMAND_SIZE,		0,				UVec3(2,3,1),	UVec3(1,2,3) },
		{ "small_offset",							"Small offset",									16+INDIRECT_COMMAND_SIZE,	16,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset",							"Large offset",									(2<<20),					(1<<20) + 12,	UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset_multiple_invocations",		"Large offset, multiple invocations",			(2<<20),					(1<<20) + 12,	UVec3(2,3,1),	UVec3(1,2,3) },
		{ "empty_command",							"Empty command",								INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(0,0,0) },
	};

	for (int genNdx = 0; genNdx < DE_LENGTH_OF_ARRAY(s_genBuffer); genNdx++)
	{
		const GenBuffer				genBuf		= s_genBuffer[genNdx].gen;
		tcu::TestCaseGroup* const	genGroup	= new tcu::TestCaseGroup(m_testCtx, s_genBuffer[genNdx].name, "");
		addChild(genGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_singleDispatchCases); ndx++)
			genGroup->addChild(new SingleDispatchCase(m_context,
													  s_singleDispatchCases[ndx].name,
													  s_singleDispatchCases[ndx].description,
													  genBuf,
													  s_singleDispatchCases[ndx].bufferSize,
													  s_singleDispatchCases[ndx].offset,
													  s_singleDispatchCases[ndx].workGroupSize,
													  s_singleDispatchCases[ndx].numWorkGroups));

		genGroup->addChild(new MultiDispatchCase				(m_context, genBuf));
		genGroup->addChild(new MultiDispatchReuseCommandCase	(m_context, genBuf));
	}
}